

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.cpp
# Opt level: O0

Word * __thiscall Word::getWord_abi_cxx11_(Word *this)

{
  string *in_RSI;
  Word *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

string Word::getWord()
{
    return _word;
}